

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

void __thiscall
QSocks5BindStore::add(QSocks5BindStore *this,qintptr socketDescriptor,QSocks5BindData *bindData)

{
  Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *this_00;
  long in_FS_OFFSET;
  QDeadlineTimer QVar1;
  longlong copy;
  QSocks5BindData *local_40;
  qintptr local_38;
  qintptr local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1.t2 = 0xffffffff;
  QVar1.type = 0x7fffffff;
  QVar1.t1 = (qint64)&this->mutex;
  local_40 = bindData;
  local_38 = socketDescriptor;
  QRecursiveMutex::tryLock(QVar1);
  this_00 = (this->store).d;
  if (this_00 != (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0x0) {
    QHashPrivate::Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_>::findNode<long_long>
              (this_00,&local_38);
  }
  QElapsedTimer::start();
  local_30 = local_38;
  QHash<long_long,QSocks5BindData*>::emplace<QSocks5BindData*const&>
            ((QHash<long_long,QSocks5BindData*> *)&this->store,&local_30,&local_40);
  if ((this->sweepTimer).m_id == Invalid) {
    QBasicTimer::start(&this->sweepTimer,60000000000,1,this);
  }
  QRecursiveMutex::unlock();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5BindStore::add(qintptr socketDescriptor, QSocks5BindData *bindData)
{
    QMutexLocker lock(&mutex);
    if (store.contains(socketDescriptor)) {
        // qDebug("delete it");
    }
    bindData->timeStamp.start();
    store.insert(socketDescriptor, bindData);

    // start sweep timer if not started
    if (!sweepTimer.isActive())
        sweepTimer.start(1min, this);
}